

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_strand.hpp
# Opt level: O0

void __thiscall asio::io_context::strand::strand(strand *this,io_context *io_context)

{
  strand_service *psVar1;
  io_context *io_context_local;
  strand *this_local;
  
  psVar1 = use_service<asio::detail::strand_service>(io_context);
  this->service_ = psVar1;
  detail::strand_service::construct(this->service_,&this->impl_);
  return;
}

Assistant:

explicit strand(asio::io_context& io_context)
    : service_(asio::use_service<
        asio::detail::strand_service>(io_context))
  {
    service_.construct(impl_);
  }